

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_accepted(ACCEPTED_HANDLE accepted)

{
  AMQP_VALUE pAVar1;
  
  if (accepted != (ACCEPTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(accepted->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_accepted(ACCEPTED_HANDLE accepted)
{
    AMQP_VALUE result;

    if (accepted == NULL)
    {
        result = NULL;
    }
    else
    {
        ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)accepted;
        result = amqpvalue_clone(accepted_instance->composite_value);
    }

    return result;
}